

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

void __thiscall QLocale::setNumberOptions(QLocale *this,NumberOptions options)

{
  QLocalePrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QLocalePrivate>::operator->(&this->d);
  (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i =
       (Int)options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
            super_QFlagsStorage<QLocale::NumberOption>.i;
  return;
}

Assistant:

void QLocale::setNumberOptions(NumberOptions options)
{
    d->m_numberOptions = options;
}